

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alListenerfv(ALenum param,ALfloat *values)

{
  uint local_20;
  uint32 local_1c;
  uint32 i;
  uint32 numvals;
  ALfloat *values_local;
  ALenum param_local;
  
  local_1c = 1;
  APILOCK();
  IO_ENTRYINFO(ALEE_alListenerfv);
  IO_ENUM(param);
  IO_PTR(values);
  switch(param) {
  case 0x1004:
    local_1c = 3;
    break;
  default:
    break;
  case 0x1006:
    local_1c = 3;
    break;
  case 0x100a:
    break;
  case 0x100f:
    local_1c = 6;
  }
  if (values == (ALfloat *)0x0) {
    local_1c = 0;
  }
  IO_UINT32(local_1c);
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    IO_FLOAT(values[local_20]);
  }
  (*REAL_alListenerfv)(param,values);
  check_listener_state();
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alListenerfv(ALenum param, const ALfloat *values)
{
    uint32 numvals = 1;
    uint32 i;
    IO_START(alListenerfv);
    IO_ENUM(param);
    IO_PTR(values);

    switch (param) {
        case AL_GAIN: break;
        case AL_POSITION: numvals = 3; break;
        case AL_VELOCITY: numvals = 3; break;
        case AL_ORIENTATION: numvals = 6; break;
        default: break;   /* uhoh. */
    }

    if (!values) { numvals = 0; }

    IO_UINT32(numvals);
    for (i = 0; i < numvals; i++) {
        IO_FLOAT(values[i]);
    }

    REAL_alListenerfv(param, values);

    check_listener_state();

    IO_END();
}